

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::HttpService::Response::sendError
          (Response *this,uint statusCode,StringPtr statusText,HttpHeaders *headers)

{
  AsyncOutputStream *pAVar1;
  undefined4 in_register_00000034;
  undefined8 in_R9;
  ArrayPtr<const_unsigned_char> AVar2;
  Promise<void> promise;
  size_t local_70;
  Maybe<unsigned_long> local_68;
  Response *local_58;
  HttpHeaders *pHStack_50;
  undefined1 local_48 [8];
  Own<kj::AsyncOutputStream,_std::nullptr_t> stream;
  HttpHeaders *headers_local;
  uint statusCode_local;
  Response *this_local;
  StringPtr statusText_local;
  
  local_58 = (Response *)statusText.content.size_;
  pHStack_50 = headers;
  this_local = local_58;
  statusText_local.content.ptr = (char *)headers;
  statusText_local.content.size_ = (size_t)this;
  local_70 = StringPtr::size((StringPtr *)&this_local);
  Maybe<unsigned_long>::Maybe(&local_68,&local_70);
  (*(code *)**(undefined8 **)CONCAT44(in_register_00000034,statusCode))
            (local_48,(undefined8 *)CONCAT44(in_register_00000034,statusCode),
             (int)statusText.content.ptr,local_58,pHStack_50,in_R9,&local_68);
  Maybe<unsigned_long>::~Maybe(&local_68);
  pAVar1 = Own<kj::AsyncOutputStream,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_48);
  AVar2 = StringPtr::asBytes((StringPtr *)&this_local);
  (**pAVar1->_vptr_AsyncOutputStream)(&stack0xffffffffffffff78,pAVar1,AVar2.ptr,AVar2.size_);
  mv<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
            ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_48);
  Promise<void>::attach<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
            ((Promise<void> *)this,
             (Own<kj::AsyncOutputStream,_std::nullptr_t> *)&stack0xffffffffffffff78);
  Promise<void>::~Promise((Promise<void> *)&stack0xffffffffffffff78);
  Own<kj::AsyncOutputStream,_std::nullptr_t>::~Own
            ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_48);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpService::Response::sendError(
    uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers) {
  auto stream = send(statusCode, statusText, headers, statusText.size());
  auto promise = stream->write(statusText.asBytes());
  return promise.attach(kj::mv(stream));
}